

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrDestroyBodyTrackerHTC(XrBodyTrackerHTC bodyTracker)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrBodyTrackerHTC_T_*>::getWithInstanceInfo(&g_bodytrackerhtc_info,bodyTracker);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyBodyTrackerHTC)(bodyTracker);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_bodytrackerhtc_info.
                super_HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>,bodyTracker);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyBodyTrackerHTC(
    XrBodyTrackerHTC bodyTracker) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_bodytrackerhtc_info.getWithInstanceInfo(bodyTracker);
        GenValidUsageXrHandleInfo *gen_bodytrackerhtc_info = info_with_instance.first;
        (void)gen_bodytrackerhtc_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyBodyTrackerHTC(bodyTracker);
        if (XR_SUCCEEDED(result)) {
            g_bodytrackerhtc_info.erase(bodyTracker);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}